

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::Field>
reflection::CreateField
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,Offset<reflection::Type> type,
          uint16_t id,uint16_t offset,int64_t default_integer,double default_real,bool deprecated,
          bool required,bool key,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,bool optional,uint16_t padding,bool offset64)

{
  Offset<reflection::Field> OVar1;
  undefined1 local_78 [8];
  FieldBuilder builder_;
  bool offset64_local;
  bool optional_local;
  bool key_local;
  bool required_local;
  bool deprecated_local;
  double default_real_local;
  int64_t default_integer_local;
  uint16_t offset_local;
  uint16_t id_local;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  documentation_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
  attributes_local;
  Offset<reflection::Type> type_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._15_1_ = deprecated;
  builder_._14_1_ = required;
  builder_._13_1_ = key;
  builder_._12_1_ = optional;
  builder_.start_._3_1_ = offset64;
  FieldBuilder::FieldBuilder((FieldBuilder *)local_78,_fbb);
  FieldBuilder::add_default_real((FieldBuilder *)local_78,default_real);
  FieldBuilder::add_default_integer((FieldBuilder *)local_78,default_integer);
  FieldBuilder::add_documentation((FieldBuilder *)local_78,documentation);
  FieldBuilder::add_attributes((FieldBuilder *)local_78,attributes);
  FieldBuilder::add_type((FieldBuilder *)local_78,type);
  FieldBuilder::add_name((FieldBuilder *)local_78,name);
  FieldBuilder::add_padding((FieldBuilder *)local_78,padding);
  FieldBuilder::add_offset((FieldBuilder *)local_78,offset);
  FieldBuilder::add_id((FieldBuilder *)local_78,id);
  FieldBuilder::add_offset64((FieldBuilder *)local_78,(bool)(builder_.start_._3_1_ & 1));
  FieldBuilder::add_optional((FieldBuilder *)local_78,(bool)(builder_._12_1_ & 1));
  FieldBuilder::add_key((FieldBuilder *)local_78,(bool)(builder_._13_1_ & 1));
  FieldBuilder::add_required((FieldBuilder *)local_78,(bool)(builder_._14_1_ & 1));
  FieldBuilder::add_deprecated((FieldBuilder *)local_78,(bool)(builder_._15_1_ & 1));
  OVar1 = FieldBuilder::Finish((FieldBuilder *)local_78);
  return (Offset<reflection::Field>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Field> CreateField(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<reflection::Type> type = 0,
    uint16_t id = 0,
    uint16_t offset = 0,
    int64_t default_integer = 0,
    double default_real = 0.0,
    bool deprecated = false,
    bool required = false,
    bool key = false,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    bool optional = false,
    uint16_t padding = 0,
    bool offset64 = false) {
  FieldBuilder builder_(_fbb);
  builder_.add_default_real(default_real);
  builder_.add_default_integer(default_integer);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_type(type);
  builder_.add_name(name);
  builder_.add_padding(padding);
  builder_.add_offset(offset);
  builder_.add_id(id);
  builder_.add_offset64(offset64);
  builder_.add_optional(optional);
  builder_.add_key(key);
  builder_.add_required(required);
  builder_.add_deprecated(deprecated);
  return builder_.Finish();
}